

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O3

Config * __thiscall Jupiter::Config::getSectionReference(Config *this,string_view in_key)

{
  _Insert_base<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this_00;
  pointer __p;
  pointer __p_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
  _Var1;
  unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
  *this_01;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this_02;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false,_false>,_bool>
  pVar2;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_48._M_str = in_key._M_str;
  local_48._M_len = in_key._M_len;
  this_02 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             *)(this->m_sections)._M_t.
               super___uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
               .
               super__Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_false>
               ._M_head_impl;
  this_01 = &this->m_sections;
  if (this_02 ==
      (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
       *)0x0) {
    __p_00 = (pointer)operator_new(0x38);
    *(undefined8 *)&(__p_00->_M_h)._M_rehash_policy = 0;
    (__p_00->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__p_00->_M_h)._M_buckets = &(__p_00->_M_h)._M_single_bucket;
    (__p_00->_M_h)._M_bucket_count = 1;
    (__p_00->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (__p_00->_M_h)._M_element_count = 0;
    (__p_00->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (__p_00->_M_h)._M_rehash_policy._M_next_resize = 0;
    (__p_00->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    local_38._M_dataplus._M_p = (pointer)0x0;
    std::
    __uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
             *)this_01,__p_00);
    std::
    unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
                   *)&local_38);
    this_02 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)(this_01->_M_t).
                 super___uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
                 .
                 super__Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_false>
                 ._M_head_impl;
  }
  _Var1._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                           (this_02,&local_48);
  if (_Var1._M_cur == (__node_type *)0x0) {
    this_00 = (_Insert_base<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)(this_01->_M_t).
                 super___uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
                 .
                 super__Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_false>
                 ._M_head_impl;
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,local_48._M_str,local_48._M_str + local_48._M_len);
    pVar2 = std::__detail::
            _Insert_base<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::try_emplace<std::__cxx11::string>(this_00,(const_iterator)0x0,&local_38);
    _Var1._M_cur = (__node_type *)
                   pVar2.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
                   ._M_cur;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)((long)&((_Var1._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>
                       ._M_storage._M_storage + 0x30) == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&((_Var1._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>
                       ._M_storage._M_storage + 0x28),0,0,local_48._M_str,local_48._M_len);
  }
  return (Config *)
         ((long)&((_Var1._M_cur)->
                 super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
                 ).
                 super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>
                 ._M_storage._M_storage + 0x20);
}

Assistant:

Jupiter::Config &Jupiter::Config::getSectionReference(std::string_view in_key) {
	if (m_sections == nullptr) {
		m_sections = std::make_unique<SectionHashTable>();
	}

	auto section = m_sections->find(JUPITER_WRAP_MAP_KEY(in_key));
	if (section == m_sections->end()) {
		// for some reason msvc doesn't like emplace
		section = m_sections->try_emplace(static_cast<std::string>(in_key)).first;
	}

	if (section->second.m_name.empty()) {
		section->second.m_name = in_key;
	}

	return section->second;
}